

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O3

void __thiscall CDT::save(CDT *this,string *filepath)

{
  ofstream file;
  long local_208;
  filebuf local_200 [24];
  byte abStack_1e8 [216];
  ios_base local_110 [264];
  
  std::ofstream::ofstream(&local_208,(string *)filepath,_S_out);
  if ((abStack_1e8[*(long *)(local_208 + -0x18)] & 5) == 0) {
    std::ofstream::close();
    local_208 = _VTT;
    *(undefined8 *)(local_200 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_200);
    std::ios_base::~ios_base(local_110);
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [saving model]: Couldn\'t open up the file!\n");
  exit(1);
}

Assistant:

void CDT::save(const std::string& filepath) const{
    std::ofstream file(filepath);

    if(!file){
        std::cout<<"ERROR [saving model]: Couldn't open up the file!\n";
        exit(1);
    }

    // TO DO

    file.close();
}